

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

SQClass * SQClass::Create(SQVM *v,SQClass *base)

{
  bool bVar1;
  SQClass *this;
  
  if (((base != (SQClass *)0x0) && (base->_lockedTypeId == 0)) && (bVar1 = Lock(base,v), !bVar1)) {
    return (SQClass *)0x0;
  }
  this = (SQClass *)sq_vm_malloc(v->_sharedstate->_alloc_ctx,0x1a8);
  SQClass(this,v,base);
  return this;
}

Assistant:

SQClass* SQClass::Create(SQVM *v,SQClass *base)
{
    if (base && !base->isLocked()) {
        if (!base->Lock(v))
            return nullptr;
    }

    SQClass *newclass = (SQClass *)SQ_MALLOC(_ss(v)->_alloc_ctx, sizeof(SQClass));
    new (newclass) SQClass(v, base);
    return newclass;
}